

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O0

UBool __thiscall
icu_63::UVector32::expandCapacity(UVector32 *this,int32_t minimumCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t *piVar2;
  int32_t *newElems;
  int32_t newCap;
  UErrorCode *status_local;
  int32_t minimumCapacity_local;
  UVector32 *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (minimumCapacity < 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._7_1_ = '\0';
    }
    else if (this->capacity < minimumCapacity) {
      if ((this->maxCapacity < 1) || (minimumCapacity <= this->maxCapacity)) {
        if (this->capacity < 0x40000000) {
          newElems._4_4_ = this->capacity << 1;
          if (newElems._4_4_ < minimumCapacity) {
            newElems._4_4_ = minimumCapacity;
          }
          if ((0 < this->maxCapacity) && (this->maxCapacity < newElems._4_4_)) {
            newElems._4_4_ = this->maxCapacity;
          }
          if (newElems._4_4_ < 0x20000000) {
            piVar2 = (int32_t *)uprv_realloc_63(this->elements,(long)newElems._4_4_ << 2);
            if (piVar2 == (int32_t *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
              this_local._7_1_ = '\0';
            }
            else {
              this->elements = piVar2;
              this->capacity = newElems._4_4_;
              this_local._7_1_ = '\x01';
            }
          }
          else {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            this_local._7_1_ = '\0';
          }
        }
        else {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          this_local._7_1_ = '\0';
        }
      }
      else {
        *status = U_BUFFER_OVERFLOW_ERROR;
        this_local._7_1_ = '\0';
      }
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool UVector32::expandCapacity(int32_t minimumCapacity, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (minimumCapacity < 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }
    if (capacity >= minimumCapacity) {
        return TRUE;
    }
    if (maxCapacity>0 && minimumCapacity>maxCapacity) {
        status = U_BUFFER_OVERFLOW_ERROR;
        return FALSE;
    }
    if (capacity > (INT32_MAX - 1) / 2) {  // integer overflow check
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }
    int32_t newCap = capacity * 2;
    if (newCap < minimumCapacity) {
        newCap = minimumCapacity;
    }
    if (maxCapacity > 0 && newCap > maxCapacity) {
        newCap = maxCapacity;
    }
    if (newCap > (int32_t)(INT32_MAX / sizeof(int32_t))) {  // integer overflow check
        // We keep the original memory contents on bad minimumCapacity/maxCapacity.
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }
    int32_t* newElems = (int32_t *)uprv_realloc(elements, sizeof(int32_t)*newCap);
    if (newElems == NULL) {
        // We keep the original contents on the memory failure on realloc.
        status = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    elements = newElems;
    capacity = newCap;
    return TRUE;
}